

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

UString * jsonnet::internal::jsonnet_string_unescape
                    (UString *__return_storage_ptr__,LocationRange *loc,UString *s)

{
  char32_t cVar1;
  unsigned_long high;
  unsigned_long low;
  StaticError *pSVar2;
  ostream *poVar3;
  char32_t *pcVar4;
  char32_t *pcVar5;
  char cVar6;
  string utf8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  pcVar4 = (s->_M_dataplus)._M_p;
  do {
    cVar1 = *pcVar4;
    if (cVar1 == L'\\') {
      pcVar5 = pcVar4 + 1;
      cVar1 = pcVar4[1];
      switch(cVar1) {
      case L'n':
        cVar1 = L'\n';
        break;
      case L'o':
      case L'p':
      case L'q':
      case L's':
switchD_00174b19_caseD_6f:
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        utf8._M_dataplus._M_p = (pointer)&utf8.field_2;
        utf8._M_string_length = 0;
        utf8.field_2._M_local_buf[0] = '\0';
        cVar1 = L'�';
        if ((uint)*pcVar5 < 0x110000) {
          cVar1 = *pcVar5;
        }
        cVar6 = (char)&utf8;
        if (0x7f < (uint)cVar1) {
          if ((uint)cVar1 < 0x800) {
            std::__cxx11::string::push_back(cVar6);
          }
          else if ((uint)cVar1 < 0x10000) {
            std::__cxx11::string::push_back(cVar6);
            std::__cxx11::string::push_back(cVar6);
          }
          else {
            std::__cxx11::string::push_back(cVar6);
            std::__cxx11::string::push_back(cVar6);
            std::__cxx11::string::push_back(cVar6);
          }
        }
        std::__cxx11::string::push_back(cVar6);
        poVar3 = std::operator<<(local_1a8,"Unknown escape sequence in string literal: \'");
        poVar3 = std::operator<<(poVar3,(string *)&utf8);
        std::operator<<(poVar3,"\'");
        pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar2,loc,&local_1d8);
        __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
      case L'r':
        cVar1 = L'\r';
        break;
      case L't':
        cVar1 = L'\t';
        break;
      case L'u':
        high = jsonnet_string_parse_unicode(loc,pcVar4 + 2);
        if ((high & 0xffffffffffffe000) == 0xe000 || high < 0xd800) {
          pcVar5 = pcVar4 + 5;
        }
        else {
          if (pcVar4[6] != L'\\') {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::operator<<(local_1a8,"Invalid non-BMP Unicode escape in string literal");
            pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
            std::__cxx11::stringbuf::str();
            StaticError::StaticError(pSVar2,loc,&utf8);
            __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
          }
          if (pcVar4[7] != L'u') {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::operator<<(local_1a8,"Invalid non-BMP Unicode escape in string literal");
            pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
            std::__cxx11::stringbuf::str();
            StaticError::StaticError(pSVar2,loc,&utf8);
            __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
          }
          low = jsonnet_string_parse_unicode(loc,pcVar4 + 8);
          cVar1 = decode_utf16_surrogates(loc,high,low);
          pcVar5 = pcVar4 + 0xb;
          high = (unsigned_long)(uint)cVar1;
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(__return_storage_ptr__,(char32_t)high);
        goto LAB_00174b6a;
      default:
        if ((((cVar1 != L'\"') && (cVar1 != L'\'')) && (cVar1 != L'/')) && (cVar1 != L'\\')) {
          if (cVar1 == L'b') {
            cVar1 = L'\b';
          }
          else {
            if (cVar1 != L'f') {
              if (cVar1 == L'\0') {
                pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&ss,"Truncated escape sequence in string literal.",
                           (allocator<char> *)&utf8);
                StaticError::StaticError(pSVar2,loc,(string *)&ss);
                __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
              }
              goto switchD_00174b19_caseD_6f;
            }
            cVar1 = L'\f';
          }
        }
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(__return_storage_ptr__,cVar1);
    }
    else {
      if (cVar1 == L'\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(__return_storage_ptr__,cVar1);
      pcVar5 = pcVar4;
    }
LAB_00174b6a:
    pcVar4 = pcVar5 + 1;
  } while( true );
}

Assistant:

UString jsonnet_string_unescape(const LocationRange &loc, const UString &s)
{
    UString r;
    const char32_t *s_ptr = s.c_str();
    for (const char32_t *c = s_ptr; *c != U'\0'; ++c) {
        switch (*c) {
            case '\\':
                switch (*(++c)) {
                    case '"':
                    case '\'': r += *c; break;

                    case '\\': r += *c; break;

                    case '/': r += *c; break;

                    case 'b': r += '\b'; break;

                    case 'f': r += '\f'; break;

                    case 'n': r += '\n'; break;

                    case 'r': r += '\r'; break;

                    case 't': r += '\t'; break;

                    case 'u': {
                        ++c;  // Consume the 'u'.
                        unsigned long codepoint = jsonnet_string_parse_unicode(loc, c);

                        // Leave us on the last char, ready for the ++c at
                        // the outer for loop.
                        c += 3;
                        if (!is_bmp_codepoint(codepoint)) {
                           if (*(++c) != '\\') {
                                std::stringstream ss;
                                ss << "Invalid non-BMP Unicode escape in string literal";
                                throw StaticError(loc, ss.str());
                           }
                           if (*(++c) != 'u') {
                                std::stringstream ss;
                                ss << "Invalid non-BMP Unicode escape in string literal";
                                throw StaticError(loc, ss.str());
                           }
                           ++c;
                           unsigned long codepoint2 = jsonnet_string_parse_unicode(loc, c);
                           c += 3;
                           codepoint = decode_utf16_surrogates(loc, codepoint, codepoint2);
                       }
                       r += codepoint;
                    } break;

                    case '\0': {
                        auto msg = "Truncated escape sequence in string literal.";
                        throw StaticError(loc, msg);
                    }

                    default: {
                        std::stringstream ss;
                        std::string utf8;
                        encode_utf8(*c, utf8);
                        ss << "Unknown escape sequence in string literal: '" << utf8 << "'";
                        throw StaticError(loc, ss.str());
                    }
                }
                break;

            default:
                // Just a regular letter.
                r += *c;
        }
    }
    return r;
}